

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeFenceCreatePrologue
          (ZEParameterValidation *this,ze_command_queue_handle_t hCommandQueue,ze_fence_desc_t *desc
          ,ze_fence_handle_t *phFence)

{
  pointer p_Var1;
  ze_result_t zVar2;
  initializer_list<_ze_structure_type_t> __l;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> baseTypes;
  allocator_type local_2d;
  _ze_structure_type_t local_2c;
  vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_> local_28;
  
  if (hCommandQueue == (ze_command_queue_handle_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else {
    zVar2 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((phFence != (ze_fence_handle_t *)0x0 && desc != (ze_fence_desc_t *)0x0) &&
       (zVar2 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 2)) {
      local_2c = ZE_STRUCTURE_TYPE_FENCE_DESC;
      __l._M_len = 1;
      __l._M_array = &local_2c;
      std::vector<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>::vector
                (&local_28,__l,&local_2d);
      zVar2 = ZE_RESULT_ERROR_INVALID_ARGUMENT;
      if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        p_Var1 = local_28.
                 super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          if (desc->stype == *p_Var1) {
            if (((int *)desc->pNext == (int *)0x0) || (*desc->pNext < 0x100000)) {
              zVar2 = ZE_RESULT_SUCCESS;
            }
            break;
          }
          p_Var1 = p_Var1 + 1;
        } while (p_Var1 != local_28.
                           super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_28.super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>.
          _M_impl.super__Vector_impl_data._M_start != (ze_structure_type_t *)0x0) {
        operator_delete(local_28.
                        super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<_ze_structure_type_t,_std::allocator<_ze_structure_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeFenceCreatePrologue(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of command queue
        const ze_fence_desc_t* desc,                    ///< [in] pointer to fence descriptor
        ze_fence_handle_t* phFence                      ///< [out] pointer to handle of fence object created
        )
    {
        if( nullptr == hCommandQueue )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phFence )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x1 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }